

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall
ON_DimStyle::SetDimScale
          (ON_DimStyle *this,double left_val,LengthUnitSystem left_us,double right_val,
          LengthUnitSystem right_us)

{
  bool bVar1;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  ON_LengthValue lvr;
  ON_LengthValue lvl;
  ON_ScaleValue sv;
  ON_LengthValue local_170;
  ON_LengthValue local_140;
  ON_ScaleValue local_110;
  ON_ScaleValue local_90;
  
  ON_LengthValue::Create
            (&local_140,left_val,left_us,0,
             ((int)CONCAT71(in_register_00000031,left_us) == 8) + CleanDecimal);
  ON_LengthValue::Create
            (&local_170,right_val,right_us,0,
             ((int)CONCAT71(in_register_00000011,right_us) == 8) + CleanDecimal);
  ON_ScaleValue::Create(&local_110,&local_140,&local_170,None);
  bVar1 = ON_ScaleValue::IsSet(&local_110);
  if (bVar1) {
    ON_ScaleValue::ON_ScaleValue(&local_90,&local_110);
    SetDimScale(this,&local_90);
    ON_ScaleValue::~ON_ScaleValue(&local_90);
  }
  ON_ScaleValue::~ON_ScaleValue(&local_110);
  ON_wString::~ON_wString(&local_170.m_length_as_string);
  ON_wString::~ON_wString(&local_170.m_length_unit_system.m_custom_unit_name);
  ON_wString::~ON_wString(&local_140.m_length_as_string);
  ON_wString::~ON_wString(&local_140.m_length_unit_system.m_custom_unit_name);
  return;
}

Assistant:

void ON_DimStyle::SetDimScale(
  double left_val,
  ON::LengthUnitSystem left_us,
  double right_val,
  ON::LengthUnitSystem right_us)
{
  const unsigned int locale_id = 0; // Will result in current locale id being used
  //const double clean_format_tol = 0.0;


  const ON_LengthValue::StringFormat left_string_format
    = (left_us == ON::LengthUnitSystem::Inches)
    ? ON_LengthValue::StringFormat::CleanProperFraction
    : ON_LengthValue::StringFormat::CleanDecimal;
  ON_LengthValue lvl = ON_LengthValue::Create(left_val, left_us, locale_id, left_string_format);

  const ON_LengthValue::StringFormat right_string_format
    = (right_us == ON::LengthUnitSystem::Inches)
    ? ON_LengthValue::StringFormat::CleanProperFraction
    : ON_LengthValue::StringFormat::CleanDecimal;
  ON_LengthValue lvr = ON_LengthValue::Create(right_val, right_us, locale_id, right_string_format);

  const ON_ScaleValue::ScaleStringFormat fmt = ON_ScaleValue::ScaleStringFormat::None;
  ON_ScaleValue sv = ON_ScaleValue::Create(lvl, lvr, fmt);
  if (sv.IsSet())
  {
    ON_DimStyle::SetDimScale(sv);
  }
}